

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O1

parser * init_parse_constants(void)

{
  void *v;
  parser *p;
  
  v = mem_zalloc(0x150);
  p = parser_new();
  parser_setpriv(p,v);
  parser_reg(p,"level-max sym label int value",parse_constants_level_max);
  parser_reg(p,"mon-gen sym label int value",parse_constants_mon_gen);
  parser_reg(p,"mon-play sym label int value",parse_constants_mon_play);
  parser_reg(p,"dun-gen sym label int value",parse_constants_dun_gen);
  parser_reg(p,"world sym label int value",parse_constants_world);
  parser_reg(p,"carry-cap sym label int value",parse_constants_carry_cap);
  parser_reg(p,"store sym label int value",parse_constants_store);
  parser_reg(p,"obj-make sym label int value",parse_constants_obj_make);
  parser_reg(p,"player sym label int value",parse_constants_player);
  parser_reg(p,"melee-critical sym label int value",parse_constants_melee_critical);
  parser_reg(p,"melee-critical-level int cutoff int mult int add str msg",
             parse_constants_melee_critical_level);
  parser_reg(p,"ranged-critical sym label int value",parse_constants_ranged_critical);
  parser_reg(p,"ranged-critical-level int cutoff int mult int add str msg",
             parse_constants_ranged_critical_level);
  parser_reg(p,"o-melee-critical sym label int value",parse_constants_o_melee_critical);
  parser_reg(p,"o-melee-critical-level uint chance uint dice str msg",
             parse_constants_o_melee_critical_level);
  parser_reg(p,"o-ranged-critical sym label int value",parse_constants_o_ranged_critical);
  parser_reg(p,"o-ranged-critical-level uint chance uint dice str msg",
             parse_constants_o_ranged_critical_level);
  return p;
}

Assistant:

static struct parser *init_parse_constants(void) {
	struct angband_constants *z = mem_zalloc(sizeof *z);
	struct parser *p = parser_new();

	parser_setpriv(p, z);
	parser_reg(p, "level-max sym label int value", parse_constants_level_max);
	parser_reg(p, "mon-gen sym label int value", parse_constants_mon_gen);
	parser_reg(p, "mon-play sym label int value", parse_constants_mon_play);
	parser_reg(p, "dun-gen sym label int value", parse_constants_dun_gen);
	parser_reg(p, "world sym label int value", parse_constants_world);
	parser_reg(p, "carry-cap sym label int value", parse_constants_carry_cap);
	parser_reg(p, "store sym label int value", parse_constants_store);
	parser_reg(p, "obj-make sym label int value", parse_constants_obj_make);
	parser_reg(p, "player sym label int value", parse_constants_player);
	parser_reg(p, "melee-critical sym label int value",
		parse_constants_melee_critical);
	parser_reg(p, "melee-critical-level int cutoff int mult int add "
		"str msg", parse_constants_melee_critical_level);
	parser_reg(p, "ranged-critical sym label int value",
		parse_constants_ranged_critical);
	parser_reg(p, "ranged-critical-level int cutoff int mult int add "
		"str msg", parse_constants_ranged_critical_level);
	parser_reg(p, "o-melee-critical sym label int value",
		parse_constants_o_melee_critical);
	parser_reg(p, "o-melee-critical-level uint chance uint dice str msg",
		parse_constants_o_melee_critical_level);
	parser_reg(p, "o-ranged-critical sym label int value",
		parse_constants_o_ranged_critical);
	parser_reg(p, "o-ranged-critical-level uint chance uint dice str msg",
		parse_constants_o_ranged_critical_level);
	return p;
}